

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O3

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int>::verifyValidity
          (StateQueryMemoryWriteGuard<unsigned_int> *this,TestContext *testCtx)

{
  ostringstream *this_00;
  long lVar1;
  qpTestResult qVar2;
  ulong uVar3;
  ulong uVar4;
  char *description;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  if ((char)this->m_preguard == -0x22) {
    uVar3 = 0xffffffffffffffff;
    do {
      if (uVar3 == 2) goto LAB_012456c9;
      uVar4 = uVar3 + 1;
      lVar1 = uVar3 + 2;
      uVar3 = uVar4;
    } while (*(char *)((long)&this->m_preguard + lVar1) == -0x22);
    if (uVar4 < 3) goto LAB_0124568d;
LAB_012456c9:
    if ((char)this->m_postguard == -0x22) {
      uVar3 = 0;
      do {
        uVar4 = uVar3;
        if (uVar4 == 3) goto LAB_01245779;
        uVar3 = uVar4 + 1;
      } while (*(char *)((long)&this->m_postguard + uVar4 + 1) == -0x22);
      if (2 < uVar4) {
LAB_01245779:
        if ((char)this->m_value != -0x22) {
          return true;
        }
        uVar3 = 0;
        do {
          uVar4 = uVar3;
          if (uVar4 == 3) goto LAB_012457a0;
          uVar3 = uVar4 + 1;
        } while (*(char *)((long)&this->m_value + uVar4 + 1) == -0x22);
        if (uVar4 < 3) {
          return true;
        }
LAB_012457a0:
        local_190._0_8_ = testCtx->m_log;
        this_00 = (ostringstream *)(local_190 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"// ERROR: Get* did not return a value",0x25);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_118);
        qVar2 = testCtx->m_testResult;
        description = "Get* did not return a value";
        goto LAB_01245756;
      }
    }
    local_190._0_8_ = testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_190 + 8),"// ERROR: Post-guard value was modified ",0x28);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
LAB_0124568d:
    local_190._0_8_ = testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_190 + 8),"// ERROR: Pre-guard value was modified ",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
  std::ios_base::~ios_base(local_118);
  qVar2 = testCtx->m_testResult;
  description = "Get* did an illegal memory write";
LAB_01245756:
  if ((qVar2 == QP_TEST_RESULT_PASS) || (qVar2 == QP_TEST_RESULT_LAST)) {
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,description);
  }
  return false;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::verifyValidity (tcu::TestContext& testCtx) const
{
	using tcu::TestLog;

	if (isPreguardContaminated())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Pre-guard value was modified " << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did an illegal memory write");

		return false;
	}
	else if (isPostguardContaminated())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Post-guard value was modified " << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did an illegal memory write");

		return false;
	}
	else if (isUndefined())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Get* did not return a value" << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did not return a value");

		return false;
	}

	return true;
}